

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_timer.c
# Opt level: O0

void handle_timeout(cio_timer *timer,void *handler_context,cio_error err)

{
  cio_error cVar1;
  cio_error err_local;
  void *handler_context_local;
  cio_timer *timer_local;
  
  if (err == CIO_SUCCESS) {
    fprintf(_stdout,"timer expired!\n");
    if (expirations < 5) {
      expirations = expirations + '\x01';
      cVar1 = cio_timer_expires_from_now(timer,5000000000,handle_timeout,(void *)0x0);
      if (cVar1 != CIO_SUCCESS) {
        fprintf(_stderr,"arming timer failed!\n");
      }
    }
    else {
      expirations = expirations + '\x01';
      cio_timer_close(timer);
      cio_eventloop_cancel(&loop);
    }
  }
  else {
    fprintf(_stderr,"timer error!\n");
  }
  return;
}

Assistant:

static void handle_timeout(struct cio_timer *timer, void *handler_context, enum cio_error err)
{
	(void)handler_context;
	if (err == CIO_SUCCESS) {
		(void)fprintf(stdout, "timer expired!\n");
		if (expirations++ < MAX_EXPIRATIONS) {
			if (cio_timer_expires_from_now(timer, FIVE_S, handle_timeout, NULL) != CIO_SUCCESS) {
				(void)fprintf(stderr, "arming timer failed!\n");
			}
		} else {
			cio_timer_close(timer);
			cio_eventloop_cancel(&loop);
		}
	} else {
		(void)fprintf(stderr, "timer error!\n");
	}
}